

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# safe_list.h
# Opt level: O1

void __thiscall obs::safe_list<Observer>::iterator::unlock(iterator *this)

{
  if (this->m_locked == true) {
    if (this->m_node == (node *)0x0) {
      __assert_fail("m_node",
                    "/workspace/llm4binary/github/license_c_cmakelists/dacap[P]observable/./obs/safe_list.h"
                    ,0xf8,"void obs::safe_list<Observer>::iterator::unlock() [T = Observer]");
    }
    node::unlock(this->m_node,this);
    this->m_value = (Observer *)0x0;
    this->m_locked = false;
    if (this->m_node->locks == 0) {
      std::condition_variable::notify_all();
      return;
    }
  }
  return;
}

Assistant:

void unlock() {
      if (!m_locked)
        return;

      assert(m_node);
      m_node->unlock(this);
      m_value = nullptr;
      m_locked = false;

      // node's locks count is zero
      if (m_node->locks == 0)
        m_list.m_delete_cv.notify_all();
    }